

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

void Gia_ManDupCones_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes,
                        Vec_Ptr_t *vRoots)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  void **ppvVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  pGVar2 = p->pObjs;
  if (pGVar2 <= pObj) {
    do {
      if (pGVar2 + p->nObjs <= pObj) break;
      iVar5 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= iVar5) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      if (p->pTravIds[iVar5] == p->nTravIds) {
        return;
      }
      p->pTravIds[iVar5] = p->nTravIds;
      uVar3 = *(ulong *)pObj;
      uVar6 = (uint)uVar3;
      uVar7 = uVar3 & 0x1fffffff;
      if (uVar7 != 0x1fffffff && -1 < (int)uVar6) {
        Gia_ManDupCones_rec(p,pObj + -uVar7,vLeaves,vNodes,vRoots);
        Gia_ManDupCones_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vLeaves,vNodes
                            ,vRoots);
        uVar6 = vNodes->nSize;
        if (uVar6 == vNodes->nCap) {
          if ((int)uVar6 < 0x10) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
            }
            vNodes->pArray = ppvVar4;
            vNodes->nCap = 0x10;
          }
          else {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar6 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar6 << 4);
            }
            vNodes->pArray = ppvVar4;
            vNodes->nCap = uVar6 * 2;
          }
        }
        else {
          ppvVar4 = vNodes->pArray;
        }
        iVar5 = vNodes->nSize;
        vNodes->nSize = iVar5 + 1;
LAB_001ed7ca:
        ppvVar4[iVar5] = pObj;
        return;
      }
      if ((-1 < (int)uVar6) || ((int)uVar7 == 0x1fffffff)) {
        if ((~uVar6 & 0x9fffffff) != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                        ,0xd66,
                        "void Gia_ManDupCones_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                       );
        }
        uVar6 = (uint)(uVar3 >> 0x20) & 0x1fffffff;
        iVar5 = p->vCis->nSize;
        if ((int)uVar6 < iVar5 - p->nRegs) {
          Vec_PtrPush(vLeaves,pObj);
          return;
        }
        iVar1 = p->vCos->nSize;
        uVar6 = (iVar1 - iVar5) + uVar6;
        if (((int)uVar6 < 0) || (iVar1 <= (int)uVar6)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = p->vCos->pArray[uVar6];
        if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pObj = pGVar2 + iVar5;
        uVar6 = vRoots->nSize;
        if (uVar6 == vRoots->nCap) {
          if ((int)uVar6 < 0x10) {
            if (vRoots->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(vRoots->pArray,0x80);
            }
            vRoots->pArray = ppvVar4;
            vRoots->nCap = 0x10;
          }
          else {
            if (vRoots->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar6 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(vRoots->pArray,(ulong)uVar6 << 4);
            }
            vRoots->pArray = ppvVar4;
            vRoots->nCap = uVar6 * 2;
          }
        }
        else {
          ppvVar4 = vRoots->pArray;
        }
        iVar5 = vRoots->nSize;
        vRoots->nSize = iVar5 + 1;
        goto LAB_001ed7ca;
      }
      pObj = pObj + -uVar7;
    } while (pGVar2 <= pObj);
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManDupCones_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes, Vec_Ptr_t * vRoots )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManDupCones_rec( p, Gia_ObjFanin0(pObj), vLeaves, vNodes, vRoots );
        Gia_ManDupCones_rec( p, Gia_ObjFanin1(pObj), vLeaves, vNodes, vRoots );
        Vec_PtrPush( vNodes, pObj );
    }
    else if ( Gia_ObjIsCo(pObj) )
        Gia_ManDupCones_rec( p, Gia_ObjFanin0(pObj), vLeaves, vNodes, vRoots );
    else if ( Gia_ObjIsRo(p, pObj) )
        Vec_PtrPush( vRoots, Gia_ObjRoToRi(p, pObj) );
    else if ( Gia_ObjIsPi(p, pObj) )
        Vec_PtrPush( vLeaves, pObj );
    else assert( 0 );
}